

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spng.c
# Opt level: O0

int discard_chunk_bytes(spng_ctx *ctx,uint32_t bytes)

{
  int iVar1;
  uint32_t local_24;
  uint32_t len;
  int ret;
  uint32_t bytes_local;
  spng_ctx *ctx_local;
  
  if (ctx == (spng_ctx *)0x0) {
    ctx_local._4_4_ = 0x50;
  }
  else if (bytes == 0) {
    ctx_local._4_4_ = 0;
  }
  else {
    len = bytes;
    if ((*(ushort *)&ctx->field_0xcc & 1) == 0) {
      iVar1 = read_chunk_bytes(ctx,bytes);
      if (iVar1 != 0) {
        return iVar1;
      }
    }
    else {
      for (; len != 0; len = len - local_24) {
        local_24 = 0x2000;
        if (len < 0x2000) {
          local_24 = len;
        }
        iVar1 = read_chunk_bytes(ctx,local_24);
        if (iVar1 != 0) {
          return iVar1;
        }
      }
    }
    ctx_local._4_4_ = 0;
  }
  return ctx_local._4_4_;
}

Assistant:

static int discard_chunk_bytes(spng_ctx *ctx, uint32_t bytes)
{
    if(ctx == NULL) return SPNG_EINTERNAL;
    if(!bytes) return 0;

    int ret;

    if(ctx->streaming) /* Do small, consecutive reads */
    {
        while(bytes)
        {
            uint32_t len = SPNG_READ_SIZE;

            if(len > bytes) len = bytes;

            ret = read_chunk_bytes(ctx, len);
            if(ret) return ret;

            bytes -= len;
        }
    }
    else
    {
        ret = read_chunk_bytes(ctx, bytes);
        if(ret) return ret;
    }

    return 0;
}